

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

string * __thiscall
nite::getTime_abi_cxx11_(string *__return_storage_ptr__,nite *this,uint timeType)

{
  char *pcVar1;
  int number;
  allocator local_5d [20];
  allocator local_49;
  string local_48;
  tm *local_28;
  tm *ptm;
  time_t currentTime;
  string *psStack_10;
  uint timeType_local;
  
  currentTime._4_4_ = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  time((time_t *)&ptm);
  local_28 = localtime((time_t *)&ptm);
  switch(currentTime._4_4_) {
  case 0:
    toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(ulong)(uint)local_28->tm_mday,number);
    break;
  case 1:
    toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(ulong)(uint)local_28->tm_mon,number);
    break;
  case 2:
    toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(ulong)(uint)local_28->tm_year,number);
    break;
  case 3:
    toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(ulong)(uint)local_28->tm_hour,number);
    break;
  case 4:
    toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(ulong)(uint)local_28->tm_min,number);
    break;
  case 5:
    toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(ulong)(uint)local_28->tm_sec,number);
    break;
  case 6:
    pcVar1 = ctime((time_t *)&ptm);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    strRemoveEndline(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NULL",local_5d);
    std::allocator<char>::~allocator((allocator<char> *)local_5d);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::getTime(unsigned timeType){
    time_t currentTime;
    time (&currentTime);
    tm * ptm= localtime(&currentTime);

	switch (timeType){
		case nite::TM::DAY:
			return toStr(ptm->tm_mday);
		break;
		case nite::TM::MONTH:
			return toStr(ptm->tm_mon);
		case nite::TM::YEAR:
			return toStr(ptm->tm_year);
		break;
		case nite::TM::HOURS:
			return toStr(ptm->tm_hour);
		break;
		case nite::TM::MINUTES:
			return toStr(ptm->tm_min);
		break;
		case nite::TM::SECONDS:
			return toStr(ptm->tm_sec);
		break;
		case nite::TM::ALL:
			return nite::strRemoveEndline(ctime(&currentTime));
		break;
	}

	return "NULL";
}